

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool SignStep(SigningProvider *provider,BaseSignatureCreator *creator,CScript *scriptPubKey,
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *ret,TxoutType *whichTypeRet,SigVersion sigversion,SignatureData *sigdata)

{
  pointer *ppvVar1;
  TaprootSpendData *pubkey_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  pointer *ppCVar2;
  pointer puVar3;
  iterator __position;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TaprootSpendData other;
  uint160 *puVar8;
  char cVar9;
  bool bVar10;
  TxoutType TVar11;
  Availability AVar12;
  iterator iVar13;
  CRIPEMD160 *this_00;
  ulong uVar14;
  long lVar15;
  _Base_ptr p_Var16;
  uint uVar17;
  char *__function;
  long lVar18;
  ulong uVar19;
  _Rb_tree_header *p_Var20;
  iterator iVar21;
  size_t sVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  result_stack;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_1;
  TapSatisfier ms_satisfier;
  CKeyID keyID;
  CPubKey pubkey;
  KeyOriginInfo info;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffd04;
  value_type *__x;
  pointer pvVar24;
  pointer pvVar25;
  undefined8 in_stack_fffffffffffffd20;
  pointer puVar26;
  pointer puVar27;
  pointer puVar28;
  undefined8 in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  SignatureData *pSVar29;
  size_t in_stack_fffffffffffffd50;
  SignatureData *pSVar30;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_298;
  Node<XOnlyPubKey> *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248 [28];
  uint uStack_22c;
  undefined1 local_228 [8];
  _Rb_tree_node_base _Stack_220;
  size_t local_200;
  undefined1 local_1f8 [16];
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  MiniscriptContext local_1d8;
  uint256 *local_1d0;
  pointer local_1c0;
  pointer local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  uchar auStack_190 [8];
  uchar local_188 [8];
  uchar auStack_180 [8];
  uchar local_178 [8];
  uchar auStack_170 [8];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_168;
  TaprootBuilder local_138;
  undefined1 local_c8 [8];
  pointer poStack_c0;
  pointer local_b8;
  uchar auStack_b0 [40];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_88;
  undefined1 local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_248._16_8_ = 0;
  stack0xfffffffffffffdd0 = 0;
  local_248._0_8_ = (CScript *)0x0;
  local_248._8_8_ = 0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_erase_at_end(ret,(ret->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  puVar28 = (pointer)0x0;
  puVar26 = (pointer)0x0;
  puVar27 = (pointer)0x0;
  pvVar25 = (pointer)0x0;
  __x = (value_type *)0x0;
  pvVar24 = (pointer)0x0;
  TVar11 = Solver(scriptPubKey,
                  (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&stack0xfffffffffffffd08);
  *whichTypeRet = TVar11;
  bVar10 = false;
  switch(TVar11) {
  case NONSTANDARD:
  case NULL_DATA:
  case WITNESS_UNKNOWN:
    break;
  case ANCHOR:
    goto switchD_00da8297_caseD_1;
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)local_c8,
               (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    bVar10 = CreateSig(creator,sigdata,provider,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &stack0xfffffffffffffd28,(CPubKey *)local_c8,scriptPubKey,sigversion);
    if (bVar10) {
      bVar10 = true;
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xfffffffffffffd28);
      break;
    }
    goto LAB_00da8eaa;
  case PUBKEYHASH:
    puVar27 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar27 != 0x14) goto LAB_00da8f11;
    local_138._0_8_ = *(undefined8 *)puVar27;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(puVar27 + 8);
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_138.m_branch.
                           super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           *(undefined4 *)(puVar27 + 0x10));
    local_c8[0] = 0xff;
    bVar10 = GetPubKey(provider,sigdata,(CKeyID *)&local_138,(CPubKey *)local_c8);
    if (bVar10) {
      bVar10 = CreateSig(creator,sigdata,provider,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &stack0xfffffffffffffd28,(CPubKey *)local_c8,scriptPubKey,sigversion);
      if (bVar10) {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xfffffffffffffd28);
        ToByteVector<CPubKey>(&local_1a8,(CPubKey *)local_c8);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,&local_1a8);
        if ((CScript *)
            local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (CScript *)0x0) {
          operator_delete(local_1a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto switchD_00da8297_caseD_1;
      }
    }
    else {
      __position._M_current =
           (sigdata->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (sigdata->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CKeyID,std::allocator<CKeyID>>::_M_realloc_insert<CKeyID_const&>
                  ((vector<CKeyID,std::allocator<CKeyID>> *)&sigdata->missing_pubkeys,__position,
                   (CKeyID *)&local_138);
      }
      else {
        *(undefined4 *)
         (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 0x10) =
             local_138.m_branch.
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        puVar8 = &(__position._M_current)->super_uint160;
        (puVar8->super_base_blob<160U>).m_data._M_elems[0] = local_138.m_valid;
        (puVar8->super_base_blob<160U>).m_data._M_elems[1] = local_138._1_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[2] = local_138._2_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[3] = local_138._3_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[4] = local_138._4_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[5] = local_138._5_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[6] = local_138._6_1_;
        (puVar8->super_base_blob<160U>).m_data._M_elems[7] = local_138._7_1_;
        *(pointer *)
         (((__position._M_current)->super_uint160).super_base_blob<160U>.m_data._M_elems + 8) =
             local_138.m_branch.
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ppCVar2 = &(sigdata->missing_pubkeys).super__Vector_base<CKeyID,_std::allocator<CKeyID>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppCVar2 = *ppCVar2 + 1;
      }
    }
    goto LAB_00da8eaa;
  case SCRIPTHASH:
    puVar27 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar27 == 0x14) {
      local_b8 = (pointer)CONCAT44(local_b8._4_4_,*(undefined4 *)(puVar27 + 0x10));
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)puVar27;
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)(puVar27 + 8);
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(local_1a8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             *(undefined4 *)(puVar27 + 0x10));
      local_c8 = (undefined1  [8])
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
      poStack_c0 = (pointer)local_1a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
      bVar10 = GetCScript(provider,sigdata,(CScriptID *)&local_1a8,(CScript *)local_248);
      if (bVar10) {
        local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248;
        if (0x1c < uStack_22c) {
          local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        }
        uVar17 = uStack_22c - 0x1d;
        if (0x1c >= uStack_22c) {
          uVar17 = uStack_22c;
        }
        local_138._0_8_ =
             (long)&(((CScript *)
                     local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)->super_CScriptBase)._union +
             (long)(int)uVar17;
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::
        emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)ret,(iterator *)&local_1a8,(iterator *)&local_138);
      }
      else {
        *(uint32_t *)((sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 0x10)
             = (uint32_t)local_b8;
        *(undefined1 (*) [8])(sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems
             = local_c8;
        *(pointer *)((sigdata->missing_redeem_script).super_base_blob<160U>.m_data._M_elems + 8) =
             poStack_c0;
      }
      break;
    }
LAB_00da8f11:
    __function = "base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]";
LAB_00da8f3d:
    __assert_fail("vch.size() == WIDTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                  ,0x2a,__function);
  case MULTISIG:
    uVar23 = (ulong)*(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
    iVar21._M_current =
         (ret->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar21._M_current ==
        (ret->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_realloc_insert<>(ret,iVar21);
    }
    else {
      ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1 = &(ret->
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    if (((long)pvVar24 - (long)__x >> 3) * -0x5555555555555555 - 3U < 0xfffffffffffffffe) {
      uVar19 = 1;
      lVar18 = 0x20;
      do {
        CPubKey::Set<unsigned_char_const*>
                  ((CPubKey *)local_c8,*(uchar **)((long)__x + lVar18 + -8),
                   *(uchar **)
                    ((long)&(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                            ._M_impl.super__Vector_impl_data._M_start + lVar18));
        bVar10 = CreateSig(creator,sigdata,provider,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &stack0xfffffffffffffd28,(CPubKey *)local_c8,scriptPubKey,sigversion);
        if ((bVar10) &&
           (uVar14 = ((long)(ret->
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ret->
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           uVar14 < uVar23 || uVar14 - uVar23 == 0)) {
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)ret,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &stack0xfffffffffffffd28);
        }
        uVar19 = uVar19 + 1;
        lVar18 = lVar18 + 0x18;
      } while (uVar19 < ((long)pvVar24 - (long)__x >> 3) * -0x5555555555555555 - 1U);
    }
    iVar21._M_current =
         (ret->
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    uVar19 = ((long)iVar21._M_current -
              (long)(ret->
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    bVar10 = uVar19 - (uVar23 + 1) == 0;
    if (uVar23 <= uVar19 && uVar19 - uVar23 != 0) break;
    lVar18 = 0;
    do {
      if (iVar21._M_current ==
          (ret->
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::_M_realloc_insert<>(ret,iVar21);
        iVar21._M_current =
             (ret->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((iVar21._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar21._M_current =
             (ret->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + 1;
        (ret->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar21._M_current;
      }
      lVar15 = ((long)iVar21._M_current -
                (long)(ret->
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               lVar18;
      lVar18 = lVar18 + 1;
    } while (lVar15 + 1U <= uVar23);
LAB_00da8eaa:
    bVar10 = false;
    break;
  case WITNESS_V0_SCRIPTHASH:
    puVar4 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar27 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_138._0_8_ = (CScript *)0x0;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_138.m_branch.
                          super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
    CRIPEMD160::CRIPEMD160((CRIPEMD160 *)local_c8);
    this_00 = CRIPEMD160::Write((CRIPEMD160 *)local_c8,puVar4,(long)puVar27 - (long)puVar4);
    CRIPEMD160::Finalize(this_00,&local_138.m_valid);
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_138._0_8_;
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_138.m_branch.
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_1a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_138.m_branch.
                           super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    bVar10 = GetCScript(provider,sigdata,(CScriptID *)&local_1a8,(CScript *)local_248);
    if (!bVar10) {
      puVar27 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar27 != 0x20) goto LAB_00da8f28;
      uVar5 = *(undefined8 *)puVar27;
      uVar6 = *(undefined8 *)(puVar27 + 8);
      uVar7 = *(undefined8 *)(puVar27 + 0x18);
      *(undefined8 *)
       ((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x10) =
           *(undefined8 *)(puVar27 + 0x10);
      *(undefined8 *)
       ((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
      *(undefined8 *)(sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems = uVar5
      ;
      *(undefined8 *)((sigdata->missing_witness_script).super_base_blob<256U>.m_data._M_elems + 8) =
           uVar6;
      goto LAB_00da8eaa;
    }
    local_c8 = (undefined1  [8])local_248;
    if (0x1c < uStack_22c) {
      local_c8 = (undefined1  [8])local_248._0_8_;
    }
    uVar17 = uStack_22c - 0x1d;
    if (0x1c >= uStack_22c) {
      uVar17 = uStack_22c;
    }
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&(((CScript *)local_c8)->super_CScriptBase)._union + (long)(int)uVar17);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::
    emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
              ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)ret,(iterator *)local_c8,(iterator *)&local_1a8);
    goto switchD_00da8297_caseD_1;
  case WITNESS_V0_KEYHASH:
    bVar10 = true;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(ret,__x);
    break;
  case WITNESS_V1_TAPROOT:
    puVar3 = (__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar3 != 0x20) {
LAB_00da8f28:
      __function = "base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]";
      goto LAB_00da8f3d;
    }
    local_268 = *(undefined8 *)puVar3;
    uStack_260 = *(undefined8 *)(puVar3 + 8);
    local_258 = *(undefined4 *)(puVar3 + 0x10);
    uStack_254 = *(undefined4 *)(puVar3 + 0x14);
    uStack_250 = *(undefined4 *)(puVar3 + 0x18);
    uStack_24c = *(undefined4 *)(puVar3 + 0x1c);
    local_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88._M_impl.super__Rb_tree_header._M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8 = (undefined1  [8])0x0;
    poStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    auStack_b0[0] = '\0';
    auStack_b0[1] = '\0';
    auStack_b0[2] = '\0';
    auStack_b0[3] = '\0';
    auStack_b0[4] = '\0';
    auStack_b0[5] = '\0';
    auStack_b0[6] = '\0';
    auStack_b0[7] = '\0';
    auStack_b0[8] = '\0';
    auStack_b0[9] = '\0';
    auStack_b0[10] = '\0';
    auStack_b0[0xb] = '\0';
    auStack_b0[0xc] = '\0';
    auStack_b0[0xd] = '\0';
    auStack_b0[0xe] = '\0';
    auStack_b0[0xf] = '\0';
    auStack_b0[0x10] = '\0';
    auStack_b0[0x11] = '\0';
    auStack_b0[0x12] = '\0';
    auStack_b0[0x13] = '\0';
    auStack_b0[0x14] = '\0';
    auStack_b0[0x15] = '\0';
    auStack_b0[0x16] = '\0';
    auStack_b0[0x17] = '\0';
    auStack_b0[0x18] = '\0';
    auStack_b0[0x19] = '\0';
    auStack_b0[0x1a] = '\0';
    auStack_b0[0x1b] = '\0';
    auStack_b0[0x1c] = '\0';
    auStack_b0[0x1d] = '\0';
    auStack_b0[0x1e] = '\0';
    auStack_b0[0x1f] = '\0';
    auStack_b0[0x20] = '\0';
    auStack_b0[0x21] = '\0';
    auStack_b0[0x22] = '\0';
    auStack_b0[0x23] = '\0';
    auStack_b0[0x24] = '\0';
    auStack_b0[0x25] = '\0';
    auStack_b0[0x26] = '\0';
    auStack_b0[0x27] = '\0';
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_138.m_valid = true;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_138.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_138.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_88._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    cVar9 = (**(code **)(*(long *)provider + 0x40))(provider,&local_268,local_c8);
    if (cVar9 != '\0') {
      local_178[0] = auStack_b0[0x18];
      local_178[1] = auStack_b0[0x19];
      local_178[2] = auStack_b0[0x1a];
      local_178[3] = auStack_b0[0x1b];
      local_178[4] = auStack_b0[0x1c];
      local_178[5] = auStack_b0[0x1d];
      local_178[6] = auStack_b0[0x1e];
      local_178[7] = auStack_b0[0x1f];
      auStack_170[0] = auStack_b0[0x20];
      auStack_170[1] = auStack_b0[0x21];
      auStack_170[2] = auStack_b0[0x22];
      auStack_170[3] = auStack_b0[0x23];
      auStack_170[4] = auStack_b0[0x24];
      auStack_170[5] = auStack_b0[0x25];
      auStack_170[6] = auStack_b0[0x26];
      auStack_170[7] = auStack_b0[0x27];
      local_188[0] = auStack_b0[8];
      local_188[1] = auStack_b0[9];
      local_188[2] = auStack_b0[10];
      local_188[3] = auStack_b0[0xb];
      local_188[4] = auStack_b0[0xc];
      local_188[5] = auStack_b0[0xd];
      local_188[6] = auStack_b0[0xe];
      local_188[7] = auStack_b0[0xf];
      auStack_180[0] = auStack_b0[0x10];
      auStack_180[1] = auStack_b0[0x11];
      auStack_180[2] = auStack_b0[0x12];
      auStack_180[3] = auStack_b0[0x13];
      auStack_180[4] = auStack_b0[0x14];
      auStack_180[5] = auStack_b0[0x15];
      auStack_180[6] = auStack_b0[0x16];
      auStack_180[7] = auStack_b0[0x17];
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_b8;
      auStack_190[0] = auStack_b0[0];
      auStack_190[1] = auStack_b0[1];
      auStack_190[2] = auStack_b0[2];
      auStack_190[3] = auStack_b0[3];
      auStack_190[4] = auStack_b0[4];
      auStack_190[5] = auStack_b0[5];
      auStack_190[6] = auStack_b0[6];
      auStack_190[7] = auStack_b0[7];
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_c8;
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)poStack_c0;
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::_Rb_tree(&local_168,&local_88);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] =
           (char)in_stack_fffffffffffffcec;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] =
           (char)((uint)in_stack_fffffffffffffcec >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] =
           (char)((uint)in_stack_fffffffffffffcec >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] =
           (char)((uint)in_stack_fffffffffffffcec >> 0x18);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] =
           (char)in_stack_fffffffffffffce8;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] =
           (char)((uint)in_stack_fffffffffffffce8 >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] =
           (char)((uint)in_stack_fffffffffffffce8 >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] =
           (char)((uint)in_stack_fffffffffffffce8 >> 0x18);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = provider;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = creator;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = (char)sigversion;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] =
           (char)(sigversion >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] =
           (char)(sigversion >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] =
           (char)(sigversion >> 0x18);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] =
           (char)in_stack_fffffffffffffd04;
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] =
           (char)((uint)in_stack_fffffffffffffd04 >> 8);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] =
           (char)((uint)in_stack_fffffffffffffd04 >> 0x10);
      other.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (char)((uint)in_stack_fffffffffffffd04 >> 0x18);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_ = __x;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_ = pvVar24;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_ = pvVar25;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x18] =
           (char)in_stack_fffffffffffffd20;
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x19] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 8);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1a] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x10);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1b] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x18);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1c] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x20);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1d] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x28);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1e] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x30);
      other.merkle_root.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (char)((ulong)in_stack_fffffffffffffd20 >> 0x38);
      other.scripts._M_t._M_impl._0_8_ = puVar26;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar27;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)puVar28;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)in_stack_fffffffffffffd40;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)in_stack_fffffffffffffd48;
      other.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffd50;
      TaprootSpendData::Merge(&sigdata->tr_spenddata,other);
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_168);
    }
    cVar9 = (**(code **)(*(long *)provider + 0x48))(provider,&local_268,&local_138);
    if (cVar9 != '\0') {
      std::optional<TaprootBuilder>::operator=(&sigdata->tr_builder,&local_138);
    }
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    local_40 = (_Base_ptr)0x0;
    pubkey_00 = &sigdata->tr_spenddata;
    bVar10 = SigningProvider::GetKeyOriginByXOnly
                       (provider,&pubkey_00->internal_key,(KeyOriginInfo *)local_58);
    if (bVar10) {
      iVar13 = std::
               _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
               ::find(&(sigdata->taproot_misc_pubkeys)._M_t,&pubkey_00->internal_key);
      if ((_Rb_tree_header *)iVar13._M_node ==
          &(sigdata->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
        _Stack_220._M_left = &_Stack_220;
        _Stack_220._M_parent = (_Base_ptr)0x0;
        local_228 = (undefined1  [8])0x0;
        _Stack_220._0_8_ = (pointer)0x0;
        local_200 = 0;
        _Stack_220._M_right = _Stack_220._M_left;
        std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
        pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo_&,_true>
                  ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)local_1f8,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_228,
                   (KeyOriginInfo *)local_58);
        std::
        _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
        ::
        _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                  ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                    *)&sigdata->taproot_misc_pubkeys,&pubkey_00->internal_key,
                   (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)local_1f8);
        if (local_1c0 != (pointer)0x0) {
          operator_delete(local_1c0,(long)local_1b0 - (long)local_1c0);
        }
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                     *)local_1f8);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                     *)local_228);
      }
    }
    local_228 = (undefined1  [8])0x0;
    _Stack_220._0_8_ = (pointer)0x0;
    _Stack_220._M_parent = (_Base_ptr)0x0;
    this = &sigdata->taproot_key_path_sig;
    if (((sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (cVar9 = (**(code **)(*(long *)creator + 0x20))
                          (creator,provider,local_228,pubkey_00,0,
                           &(sigdata->tr_spenddata).merkle_root,2), cVar9 != '\0')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
    }
    if (((sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (sigdata->taproot_key_path_sig).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (cVar9 = (**(code **)(*(long *)creator + 0x20))(creator,provider,local_228,&local_268,0,0,2),
       cVar9 != '\0')) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
    }
    if ((sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (sigdata->taproot_key_path_sig).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (local_228 != (undefined1  [8])0x0) {
        operator_delete((void *)local_228,(long)_Stack_220._M_parent - (long)local_228);
      }
      if ((pointer)local_58._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._8_8_,(long)local_40 - local_58._8_8_);
      }
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var16 = (sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      p_Var20 = &(sigdata->tr_spenddata).scripts._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var16 == p_Var20) {
LAB_00da8e64:
        bVar10 = false;
      }
      else {
        do {
          pSVar29 = (SignatureData *)0x0;
          pSVar30 = (SignatureData *)0x0;
          if (*(int *)&p_Var16[1]._M_right == 0xc0) {
            puVar4 = *(uchar **)(p_Var16 + 1);
            sVar22 = (long)p_Var16[1]._M_parent - (long)puVar4;
            script.m_size = sVar22;
            script.m_data = puVar4;
            ComputeTapleafHash((uint256 *)local_228,0xc0,script);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,puVar4,
                       puVar4 + sVar22);
            local_1f8._8_8_ = sigdata;
            local_1e0 = (_Base_ptr)local_58;
            local_1d8 = TAPSCRIPT;
            local_1d0 = (uint256 *)local_228;
            local_1f8._0_8_ = provider;
            local_1e8 = (_Base_ptr)creator;
            miniscript::FromScript<TapSatisfier>
                      ((miniscript *)&local_278,(CScript *)local_1e0,(TapSatisfier *)local_1f8);
            if (local_278 == (Node<XOnlyPubKey> *)0x0) {
              bVar10 = false;
            }
            else {
              AVar12 = miniscript::Node<XOnlyPubKey>::Satisfy<TapSatisfier>
                                 (local_278,(TapSatisfier *)local_1f8,
                                  (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&stack0xfffffffffffffd48,true);
              bVar10 = AVar12 == YES;
            }
            if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
            }
            if (0x1c < local_40._4_4_) {
              free((void *)local_58._0_8_);
            }
            if (bVar10) {
              local_1f8._0_8_ = *(undefined8 *)(p_Var16 + 1);
              local_228 = (undefined1  [8])p_Var16[1]._M_parent;
              std::
              vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ::
              emplace_back<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          *)&stack0xfffffffffffffd48,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_1f8,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_228);
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&stack0xfffffffffffffd48,(value_type *)(p_Var16[2]._M_right + 1));
              if (local_298.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_298.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_1f8._0_8_ = (SignatureData *)0x0;
                VectorFormatter<DefaultFormatter>::
                Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                          ((VectorFormatter<DefaultFormatter> *)local_228,(SizeComputer *)local_1f8,
                           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)&stack0xfffffffffffffd48);
                uVar5 = local_1f8._0_8_;
                local_1f8._0_8_ = (SignatureData *)0x0;
                VectorFormatter<DefaultFormatter>::
                Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                          ((VectorFormatter<DefaultFormatter> *)local_228,(SizeComputer *)local_1f8,
                           &local_298);
                if ((ulong)local_1f8._0_8_ <= (ulong)uVar5) goto LAB_00da8de3;
              }
              local_1e8 = (_Base_ptr)
                          local_298.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_298.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1f8._0_8_ =
                   local_298.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_298.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar29;
              local_1f8._8_8_ =
                   local_298.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_298.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar30;
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_1f8);
            }
          }
LAB_00da8de3:
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&stack0xfffffffffffffd48);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var20);
        if (local_298.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_298.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_00da8e64;
        local_1e8 = (_Base_ptr)
                    (ret->
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage;
        (ret->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_298.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1f8._0_8_ =
             (ret->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_1f8._8_8_ =
             (ret->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        (ret->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             local_298.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (ret->
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_298.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_298.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_1f8);
        bVar10 = true;
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_298);
    }
    else {
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::reserve(&local_298,1);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&local_298,this);
      local_1e8 = (_Base_ptr)
                  (ret->
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (ret->
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_298.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1f8._0_8_ =
           (ret->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_1f8._8_8_ =
           (ret->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      (ret->
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_298.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (ret->
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_298.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_1f8);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_298);
      if (local_228 != (undefined1  [8])0x0) {
        operator_delete((void *)local_228,(long)_Stack_220._M_parent - (long)local_228);
      }
      if ((pointer)local_58._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._8_8_,(long)local_40 - local_58._8_8_);
      }
      bVar10 = true;
    }
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::~vector(&local_138.m_branch);
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_88);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x1e2,
                  "bool SignStep(const SigningProvider &, const BaseSignatureCreator &, const CScript &, std::vector<valtype> &, TxoutType &, SigVersion, SignatureData &)"
                 );
  }
switchD_00da8297_caseD_0:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&stack0xfffffffffffffd08);
  if (puVar26 != (pointer)0x0) {
    operator_delete(puVar26,(long)puVar28 - (long)puVar26);
  }
  if (0x1c < uStack_22c) {
    free((void *)local_248._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
switchD_00da8297_caseD_1:
  bVar10 = true;
  goto switchD_00da8297_caseD_0;
}

Assistant:

static bool SignStep(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& scriptPubKey,
                     std::vector<valtype>& ret, TxoutType& whichTypeRet, SigVersion sigversion, SignatureData& sigdata)
{
    CScript scriptRet;
    ret.clear();
    std::vector<unsigned char> sig;

    std::vector<valtype> vSolutions;
    whichTypeRet = Solver(scriptPubKey, vSolutions);

    switch (whichTypeRet) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
        return false;
    case TxoutType::PUBKEY:
        if (!CreateSig(creator, sigdata, provider, sig, CPubKey(vSolutions[0]), scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        return true;
    case TxoutType::PUBKEYHASH: {
        CKeyID keyID = CKeyID(uint160(vSolutions[0]));
        CPubKey pubkey;
        if (!GetPubKey(provider, sigdata, keyID, pubkey)) {
            // Pubkey could not be found, add to missing
            sigdata.missing_pubkeys.push_back(keyID);
            return false;
        }
        if (!CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        ret.push_back(ToByteVector(pubkey));
        return true;
    }
    case TxoutType::SCRIPTHASH: {
        uint160 h160{vSolutions[0]};
        if (GetCScript(provider, sigdata, CScriptID{h160}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find redeemScript, add to missing
        sigdata.missing_redeem_script = h160;
        return false;
    }
    case TxoutType::MULTISIG: {
        size_t required = vSolutions.front()[0];
        ret.emplace_back(); // workaround CHECKMULTISIG bug
        for (size_t i = 1; i < vSolutions.size() - 1; ++i) {
            CPubKey pubkey = CPubKey(vSolutions[i]);
            // We need to always call CreateSig in order to fill sigdata with all
            // possible signatures that we can create. This will allow further PSBT
            // processing to work as it needs all possible signature and pubkey pairs
            if (CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) {
                if (ret.size() < required + 1) {
                    ret.push_back(std::move(sig));
                }
            }
        }
        bool ok = ret.size() == required + 1;
        for (size_t i = 0; i + ret.size() < required + 1; ++i) {
            ret.emplace_back();
        }
        return ok;
    }
    case TxoutType::WITNESS_V0_KEYHASH:
        ret.push_back(vSolutions[0]);
        return true;

    case TxoutType::WITNESS_V0_SCRIPTHASH:
        if (GetCScript(provider, sigdata, CScriptID{RIPEMD160(vSolutions[0])}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find witnessScript, add to missing
        sigdata.missing_witness_script = uint256(vSolutions[0]);
        return false;

    case TxoutType::WITNESS_V1_TAPROOT:
        return SignTaproot(provider, creator, WitnessV1Taproot(XOnlyPubKey{vSolutions[0]}), sigdata, ret);

    case TxoutType::ANCHOR:
        return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}